

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::readBasis(Highs *this,string *filename)

{
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *__x;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *__x_00;
  HighsLogOptions *log_options;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  pointer pcVar1;
  bool bVar2;
  HighsStatus HVar3;
  HighsBasis read_basis;
  string local_138;
  undefined1 local_118 [16];
  _Alloc_hider local_108;
  char local_f8 [16];
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_e8;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_d0;
  string local_b8;
  HighsLogOptions local_98;
  
  if ((this->written_log_header_ == false) &&
     (*(this->options_).super_HighsOptionsStruct.log_options.output_flag == true)) {
    highsLogHeader(&(this->options_).super_HighsOptionsStruct.log_options,
                   (this->options_).super_HighsOptionsStruct.log_githash);
    this->written_log_header_ = true;
  }
  local_118._8_4_ = (this->basis_).debug_update_count;
  local_118[0] = (this->basis_).valid;
  local_118[1] = (this->basis_).alien;
  local_118[2] = (this->basis_).useful;
  local_118[3] = (this->basis_).was_alien;
  local_118._4_4_ = (this->basis_).debug_id;
  pcVar1 = (this->basis_).debug_origin_name._M_dataplus._M_p;
  local_108._M_p = local_f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar1,pcVar1 + (this->basis_).debug_origin_name._M_string_length)
  ;
  __x = &(this->basis_).col_status;
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector(&local_e8,__x);
  __x_00 = &(this->basis_).row_status;
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector(&local_d0,__x_00);
  local_98.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
  local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
  local_98.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
  local_98.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
  local_98.user_log_callback =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
  local_98.user_log_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
  this_00 = &local_98.user_callback;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::function(this_00,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
  local_98.user_callback_active =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
  local_98.user_callback_data =
       (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar1,pcVar1 + filename->_M_string_length);
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  HVar3 = readBasisFile(log_options,(HighsBasis *)local_118,&local_138);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"readBasis","");
  HVar3 = interpretCallStatus(&local_98,HVar3,kOk,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.user_callback.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  if (HVar3 == kOk) {
    bVar2 = isBasisConsistent(&(this->model_).lp_,(HighsBasis *)local_118);
    if (bVar2) {
      (this->basis_).debug_update_count = local_118._8_4_;
      (this->basis_).valid = (bool)local_118[0];
      (this->basis_).alien = (bool)local_118[1];
      (this->basis_).useful = (bool)local_118[2];
      (this->basis_).was_alien = (bool)local_118[3];
      (this->basis_).debug_id = local_118._4_4_;
      std::__cxx11::string::_M_assign((string *)&(this->basis_).debug_origin_name);
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=(__x,&local_e8);
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=(__x_00,&local_d0);
      (this->basis_).valid = true;
      (this->basis_).useful = true;
      HVar3 = kOk;
      HEkk::updateStatus(&this->ekk_instance_,kNewBasis);
    }
    else {
      HVar3 = kError;
      highsLogUser(log_options,kError,"readBasis: invalid basis\n");
    }
  }
  if (local_d0.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108._M_p != local_f8) {
    operator_delete(local_108._M_p);
  }
  return HVar3;
}

Assistant:

HighsStatus Highs::readBasis(const std::string& filename) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  // Try to read basis file into read_basis
  HighsBasis read_basis = basis_;
  return_status = interpretCallStatus(
      options_.log_options,
      readBasisFile(options_.log_options, read_basis, filename), return_status,
      "readBasis");
  if (return_status != HighsStatus::kOk) return return_status;
  // Basis read OK: check whether it's consistent with the LP
  if (!isBasisConsistent(model_.lp_, read_basis)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "readBasis: invalid basis\n");
    return HighsStatus::kError;
  }
  // Update the HiGHS basis and invalidate any simplex basis for the model
  basis_ = read_basis;
  basis_.valid = true;
  basis_.useful = true;
  // Follow implications of a new HiGHS basis
  newHighsBasis();
  // Can't use returnFromHighs since...
  return HighsStatus::kOk;
}